

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

void __thiscall Fl_Input_::drawtext(Fl_Input_ *this,int X,int Y,int W,int H)

{
  float fVar1;
  byte bVar2;
  int iVar3;
  Fl_Boxtype FVar4;
  Fl_Boxtype FVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fl_Color FVar9;
  Fl_Color bg;
  Fl_Font font;
  Fl_Fontsize size;
  Fl_Input_ *pFVar10;
  char *pcVar11;
  size_t sVar12;
  Fl_Window *win;
  long lVar13;
  bool bVar14;
  double dVar15;
  float local_504;
  int local_4a0;
  float local_49c;
  int offset2;
  float x2;
  int offset1;
  float x1;
  char *pp_1;
  float xx;
  float r;
  char *pp;
  int ypos;
  float xpos;
  int desc;
  Fl_Color tc;
  int newy;
  int ex;
  int newscroll;
  int cury;
  int curx;
  int lines;
  int threshold;
  int height;
  char buf [1024];
  char *local_40;
  char *e;
  char *p;
  int local_28;
  int selend;
  int selstart;
  int do_mu;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Input_ *this_local;
  
  bVar2 = Fl_Widget::damage(&this->super_Fl_Widget);
  bVar14 = (bVar2 & 0x80) == 0;
  pFVar10 = (Fl_Input_ *)Fl::focus();
  if ((pFVar10 == this) || (iVar3 = Fl_Input_::size(this), iVar3 != 0)) {
    pFVar10 = (Fl_Input_ *)Fl::focus();
    if ((pFVar10 == this) || (pFVar10 = (Fl_Input_ *)Fl::pushed(), pFVar10 == this)) {
      iVar3 = position(this);
      iVar6 = mark(this);
      if (iVar6 < iVar3) {
        p._4_4_ = position(this);
        local_28 = mark(this);
      }
      else {
        local_28 = position(this);
        p._4_4_ = mark(this);
      }
    }
    else {
      p._4_4_ = 0;
      local_28 = 0;
    }
    setfont(this);
    lines = fl_height();
    curx = lines / 2;
    e = value(this);
    cury = 0;
    ex = 0;
    newscroll = 0;
    while( true ) {
      local_40 = expand(this,e,(char *)&threshold);
      iVar3 = position(this);
      pcVar11 = value(this);
      if ((long)e - (long)pcVar11 <= (long)iVar3) {
        iVar3 = position(this);
        pcVar11 = value(this);
        if ((long)iVar3 <= (long)local_40 - (long)pcVar11) {
          pcVar11 = value(this);
          iVar3 = position(this);
          dVar15 = expandpos(this,e,pcVar11 + iVar3,(char *)&threshold,(int *)0x0);
          newscroll = (int)(dVar15 + 0.5);
          pFVar10 = (Fl_Input_ *)Fl::focus();
          if ((pFVar10 == this) && (was_up_down == 0)) {
            up_down_pos = (double)newscroll;
          }
          ex = cury * lines;
          newy = this->xscroll_;
          if ((newy + W) - curx < newscroll) {
            newy = (newscroll + curx) - W;
            dVar15 = expandpos(this,e,local_40,(char *)&threshold,(int *)0x0);
            tc = ((int)dVar15 + 4) - W;
            if ((int)tc < newy) {
              newy = tc;
            }
          }
          else if (newscroll < newy + curx) {
            newy = newscroll - curx;
          }
          if (newy < 0) {
            newy = 0;
          }
          if (newy != this->xscroll_) {
            this->xscroll_ = newy;
            this->mu_p = 0;
            this->erase_cursor_only = '\0';
          }
        }
      }
      cury = cury + 1;
      if (this->value_ + this->size_ <= local_40) break;
      e = local_40 + 1;
    }
    iVar3 = input_type(this);
    if (iVar3 == 4) {
      desc = this->yscroll_;
      if (ex < desc) {
        desc = ex;
      }
      if ((desc + H) - lines < ex) {
        desc = (ex - H) + lines;
      }
      if (desc < -1) {
        desc = -1;
      }
      if (desc != this->yscroll_) {
        this->yscroll_ = desc;
        this->mu_p = 0;
        this->erase_cursor_only = '\0';
      }
    }
    else {
      this->yscroll_ = -(H - lines) / 2;
    }
    fl_push_clip(X,Y,W,H);
    iVar3 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if (iVar3 == 0) {
      FVar9 = textcolor(this);
      local_504 = (float)fl_inactive(FVar9);
    }
    else {
      local_504 = (float)textcolor(this);
    }
    xpos = local_504;
    e = value(this);
    iVar3 = lines;
    iVar6 = fl_descent();
    ypos = iVar3 - iVar6;
    pp._4_4_ = (float)((X - this->xscroll_) + 1);
    pp._0_4_ = -this->yscroll_;
    while ((int)pp < H) {
      if (1 < cury) {
        local_40 = expand(this,e,(char *)&threshold);
      }
      if ((int)pp != -lines && SBORROW4((int)pp,-lines) == (int)pp + lines < 0) {
        if (bVar14) {
          _xx = value(this);
          _xx = _xx + this->mu_p;
          if (_xx <= local_40) {
            iVar3 = readonly(this);
            fVar1 = pp._4_4_;
            if (iVar3 != 0) {
              this->erase_cursor_only = '\0';
            }
            if ((this->erase_cursor_only == '\0') || (e <= _xx)) {
              pp_1._4_4_ = (float)(X + W);
              if (e < _xx) {
                dVar15 = expandpos(this,e,_xx,(char *)&threshold,(int *)0x0);
                pp_1._0_4_ = fVar1 + (float)dVar15;
                if (this->erase_cursor_only == '\0') {
                  iVar3 = readonly(this);
                  if (iVar3 != 0) {
                    pp_1._0_4_ = pp_1._0_4_ - 3.0;
                  }
                }
                else {
                  pp_1._4_4_ = pp_1._0_4_ + 2.0;
                }
              }
              else {
                pp_1._0_4_ = (float)X;
                if (this->erase_cursor_only == '\0') {
                  iVar3 = readonly(this);
                  if (iVar3 != 0) {
                    pp_1._0_4_ = pp_1._0_4_ - 3.0;
                  }
                }
                else {
                  pp_1._4_4_ = pp._4_4_ + 2.0;
                }
              }
              fl_push_clip(((int)pp_1._0_4_ + -1) - lines / 8,Y + (int)pp,
                           (int)((pp_1._4_4_ - pp_1._0_4_) + 2.0 + (float)(lines / 4)),lines);
              FVar4 = Fl_Widget::box(&this->super_Fl_Widget);
              FVar5 = Fl_Widget::box(&this->super_Fl_Widget);
              iVar3 = Fl::box_dx(FVar5);
              FVar5 = Fl_Widget::box(&this->super_Fl_Widget);
              iVar6 = Fl::box_dy(FVar5);
              FVar5 = Fl_Widget::box(&this->super_Fl_Widget);
              iVar7 = Fl::box_dw(FVar5);
              FVar5 = Fl_Widget::box(&this->super_Fl_Widget);
              iVar8 = Fl::box_dh(FVar5);
              FVar9 = Fl_Widget::color(&this->super_Fl_Widget);
              Fl_Widget::draw_box(&this->super_Fl_Widget,FVar4,X - iVar3,Y - iVar6,W + iVar7,
                                  H + iVar8,FVar9);
              goto LAB_001f8844;
            }
          }
        }
        else {
LAB_001f8844:
          if (((local_28 < p._4_4_) &&
              (pcVar11 = value(this), (long)local_28 <= (long)local_40 - (long)pcVar11)) &&
             (pcVar11 = value(this), (long)e - (long)pcVar11 < (long)p._4_4_)) {
            _offset1 = value(this);
            _offset1 = _offset1 + local_28;
            x2 = pp._4_4_;
            offset2 = 0;
            if (e < _offset1) {
              fl_color((Fl_Color)xpos);
              dVar15 = expandpos(this,e,_offset1,(char *)&threshold,&offset2);
              x2 = (float)dVar15 + x2;
              fl_draw((char *)&threshold,offset2,pp._4_4_,(float)(Y + (int)pp + ypos));
            }
            _offset1 = value(this);
            fVar1 = pp._4_4_;
            _offset1 = _offset1 + p._4_4_;
            local_49c = (float)(X + W);
            if (local_40 < _offset1) {
              sVar12 = strlen((char *)&threshold);
              local_4a0 = (int)sVar12;
            }
            else {
              dVar15 = expandpos(this,e,_offset1,(char *)&threshold,&local_4a0);
              local_49c = fVar1 + (float)dVar15;
            }
            FVar9 = Fl_Widget::selection_color(&this->super_Fl_Widget);
            fl_color(FVar9);
            fl_rectf((int)(x2 + 0.5),Y + (int)pp,(int)((local_49c - x2) + 0.5),lines);
            FVar9 = textcolor(this);
            bg = Fl_Widget::selection_color(&this->super_Fl_Widget);
            FVar9 = fl_contrast(FVar9,bg);
            fl_color(FVar9);
            fl_draw((char *)((long)&threshold + (long)offset2),local_4a0 - offset2,x2,
                    (float)(Y + (int)pp + ypos));
            if (_offset1 < local_40) {
              fl_color((Fl_Color)xpos);
              lVar13 = (long)local_4a0;
              sVar12 = strlen((char *)((long)&threshold + (long)local_4a0));
              fl_draw((char *)((long)&threshold + lVar13),(int)sVar12,local_49c,
                      (float)(Y + (int)pp + ypos));
            }
          }
          else {
            fl_color((Fl_Color)xpos);
            sVar12 = strlen((char *)&threshold);
            fl_draw((char *)&threshold,(int)sVar12,pp._4_4_,(float)(Y + (int)pp + ypos));
          }
          if (bVar14) {
            fl_pop_clip();
          }
        }
        pFVar10 = (Fl_Input_ *)Fl::focus();
        if ((pFVar10 == this) && (local_28 == p._4_4_)) {
          iVar3 = position(this);
          pcVar11 = value(this);
          if ((long)e - (long)pcVar11 <= (long)iVar3) {
            iVar3 = position(this);
            pcVar11 = value(this);
            if ((long)iVar3 <= (long)local_40 - (long)pcVar11) {
              FVar9 = cursor_color(this);
              fl_color(FVar9);
              pcVar11 = value(this);
              iVar3 = position(this);
              dVar15 = expandpos(this,e,pcVar11 + iVar3,(char *)&threshold,(int *)0x0);
              newscroll = (int)(dVar15 + 0.5);
              iVar3 = readonly(this);
              if (iVar3 == 0) {
                fl_rectf((int)(pp._4_4_ + (float)newscroll + 0.5),Y + (int)pp,2,lines);
              }
              else {
                fl_line((int)((pp._4_4_ + (float)newscroll) - 2.5),Y + (int)pp + lines + -1,
                        (int)(pp._4_4_ + (float)newscroll + 0.5),Y + (int)pp + lines + -4,
                        (int)(pp._4_4_ + (float)newscroll + 3.5),Y + (int)pp + lines + -1);
              }
            }
          }
        }
      }
      pp._0_4_ = lines + (int)pp;
      if (this->value_ + this->size_ <= local_40) break;
      if ((*local_40 == '\n') || (*local_40 == ' ')) {
        local_40 = local_40 + 1;
      }
      e = local_40;
    }
    iVar3 = input_type(this);
    if ((((iVar3 == 4) && (bVar14)) && ((int)pp < H)) &&
       ((this->erase_cursor_only == '\0' || (pcVar11 = value(this), e <= pcVar11 + this->mu_p)))) {
      if ((int)pp < 0) {
        pp._0_4_ = 0;
      }
      fl_push_clip(X,Y + (int)pp,W,H - (int)pp);
      FVar4 = Fl_Widget::box(&this->super_Fl_Widget);
      FVar5 = Fl_Widget::box(&this->super_Fl_Widget);
      iVar3 = Fl::box_dx(FVar5);
      FVar5 = Fl_Widget::box(&this->super_Fl_Widget);
      iVar6 = Fl::box_dy(FVar5);
      FVar5 = Fl_Widget::box(&this->super_Fl_Widget);
      iVar7 = Fl::box_dw(FVar5);
      FVar5 = Fl_Widget::box(&this->super_Fl_Widget);
      iVar8 = Fl::box_dh(FVar5);
      FVar9 = Fl_Widget::color(&this->super_Fl_Widget);
      Fl_Widget::draw_box(&this->super_Fl_Widget,FVar4,X - iVar3,Y - iVar6,W + iVar7,H + iVar8,FVar9
                         );
      fl_pop_clip();
    }
    fl_pop_clip();
    pFVar10 = (Fl_Input_ *)Fl::focus();
    if (pFVar10 == this) {
      font = textfont(this);
      size = textsize(this);
      iVar3 = (int)pp._4_4_ + newscroll;
      iVar6 = Y + (int)pp;
      iVar7 = fl_descent();
      win = Fl_Widget::window(&this->super_Fl_Widget);
      fl_set_spot(font,size,iVar3,iVar6 - iVar7,W,H,win);
    }
  }
  else if (bVar14) {
    FVar4 = Fl_Widget::box(&this->super_Fl_Widget);
    FVar5 = Fl_Widget::box(&this->super_Fl_Widget);
    iVar3 = Fl::box_dx(FVar5);
    FVar5 = Fl_Widget::box(&this->super_Fl_Widget);
    iVar6 = Fl::box_dy(FVar5);
    FVar5 = Fl_Widget::box(&this->super_Fl_Widget);
    iVar7 = Fl::box_dw(FVar5);
    FVar5 = Fl_Widget::box(&this->super_Fl_Widget);
    iVar8 = Fl::box_dh(FVar5);
    FVar9 = Fl_Widget::color(&this->super_Fl_Widget);
    Fl_Widget::draw_box(&this->super_Fl_Widget,FVar4,X - iVar3,Y - iVar6,W + iVar7,H + iVar8,FVar9);
  }
  return;
}

Assistant:

void Fl_Input_::drawtext(int X, int Y, int W, int H) {
  int do_mu = !(damage()&FL_DAMAGE_ALL);

  if (Fl::focus()!=this && !size()) {
    if (do_mu) { // we have to erase it if cursor was there
      draw_box(box(), X-Fl::box_dx(box()), Y-Fl::box_dy(box()),
               W+Fl::box_dw(box()), H+Fl::box_dh(box()), color());
    }
    return;
  }

  int selstart, selend;
  if (Fl::focus()!=this && /*Fl::selection_owner()!=this &&*/ Fl::pushed()!=this)
    selstart = selend = 0;
  else if (position() <= mark()) {
    selstart = position(); selend = mark();
  } else {
    selend = position(); selstart = mark();
  }

  setfont();
  const char *p, *e;
  char buf[MAXBUF];

  // count how many lines and put the last one into the buffer:
  // And figure out where the cursor is:
  int height = fl_height();
  int threshold = height/2;
  int lines;
  int curx, cury;
  for (p=value(), curx=cury=lines=0; ;) {
    e = expand(p, buf);
    if (position() >= p-value() && position() <= e-value()) {
      curx = int(expandpos(p, value()+position(), buf, 0)+.5);
      if (Fl::focus()==this && !was_up_down) up_down_pos = curx;
      cury = lines*height;
      int newscroll = xscroll_;
      if (curx > newscroll+W-threshold) {
	// figure out scrolling so there is space after the cursor:
	newscroll = curx+threshold-W;
	// figure out the furthest left we ever want to scroll:
	int ex = int(expandpos(p, e, buf, 0))+4-W;
	// use minimum of both amounts:
	if (ex < newscroll) newscroll = ex;
      } else if (curx < newscroll+threshold) {
	newscroll = curx-threshold;
      }
      if (newscroll < 0) newscroll = 0;
      if (newscroll != xscroll_) {
	xscroll_ = newscroll;
	mu_p = 0; erase_cursor_only = 0;
      }
    }
    lines++;
    if (e >= value_+size_) break;
    p = e+1;
  }

  // adjust the scrolling:
  if (input_type()==FL_MULTILINE_INPUT) {
    int newy = yscroll_;
    if (cury < newy) newy = cury;
    if (cury > newy+H-height) newy = cury-H+height;
    if (newy < -1) newy = -1;
    if (newy != yscroll_) {yscroll_ = newy; mu_p = 0; erase_cursor_only = 0;}
  } else {
    yscroll_ = -(H-height)/2;
  }

  fl_push_clip(X, Y, W, H);
  Fl_Color tc = active_r() ? textcolor() : fl_inactive(textcolor());

  p = value();
  // visit each line and draw it:
  int desc = height-fl_descent();
  float xpos = (float)(X - xscroll_ + 1);
  int ypos = -yscroll_;
  for (; ypos < H;) {

    // re-expand line unless it is the last one calculated above:
    if (lines>1) e = expand(p, buf);

    if (ypos <= -height) goto CONTINUE; // clipped off top

    if (do_mu) {	// for minimal update:
      const char* pp = value()+mu_p; // pointer to where minimal update starts
      if (e < pp) goto CONTINUE2; // this line is before the changes
      if (readonly()) erase_cursor_only = 0; // this isn't the most efficient way
      if (erase_cursor_only && p > pp) goto CONTINUE2; // this line is after
      // calculate area to erase:
      float r = (float)(X+W);
      float xx;
      if (p >= pp) {
	xx = (float)X;
	if (erase_cursor_only) r = xpos+2;
	else if (readonly()) xx -= 3;
      } else {
	xx = xpos + (float)expandpos(p, pp, buf, 0);
	if (erase_cursor_only) r = xx+2;
	else if (readonly()) xx -= 3;
      }
      // clip to and erase it:
      fl_push_clip((int)xx-1-height/8, Y+ypos, (int)(r-xx+2+height/4), height);
      draw_box(box(), X-Fl::box_dx(box()), Y-Fl::box_dy(box()),
               W+Fl::box_dw(box()), H+Fl::box_dh(box()), color());
      // it now draws entire line over it
      // this should not draw letters to left of erased area, but
      // that is nyi.
    }

    // Draw selection area if required:
    if (selstart < selend && selstart <= e-value() && selend > p-value()) {
      const char* pp = value()+selstart;
      float x1 = xpos;
      int offset1 = 0;
      if (pp > p) {
	fl_color(tc);
	x1 += (float)expandpos(p, pp, buf, &offset1);
	fl_draw(buf, offset1, xpos, (float)(Y+ypos+desc));
      }
      pp = value()+selend;
      float x2 = (float)(X+W);
      int offset2;
      if (pp <= e) x2 = xpos + (float)expandpos(p, pp, buf, &offset2);
      else offset2 = (int) strlen(buf);
#ifdef __APPLE__ // Mac OS: underline marked ( = selected + Fl::compose_state != 0) text 
      if (Fl::compose_state) {
        fl_color(textcolor());
      }
      else 
#endif
      {
      fl_color(selection_color());
      fl_rectf((int)(x1+0.5), Y+ypos, (int)(x2-x1+0.5), height);
      fl_color(fl_contrast(textcolor(), selection_color()));
      }
      fl_draw(buf+offset1, offset2-offset1, x1, (float)(Y+ypos+desc));
#ifdef __APPLE__ // Mac OS: underline marked ( = selected + Fl::compose_state != 0) text
      if (Fl::compose_state) {
        fl_color( fl_color_average(textcolor(), color(), 0.6) );
        float width = fl_width(buf+offset1, offset2-offset1);
        fl_line(x1, Y+ypos+height-1, x1+width, Y+ypos+height-1);
      }
#endif
      if (pp < e) {
	fl_color(tc);
	fl_draw(buf+offset2, (int) strlen(buf+offset2), x2, (float)(Y+ypos+desc));
      }
    } else {
      // draw unselected text
      fl_color(tc);
      fl_draw(buf, (int) strlen(buf), xpos, (float)(Y+ypos+desc));
    }

    if (do_mu) fl_pop_clip();

  CONTINUE2:
    // draw the cursor:
    if (Fl::focus() == this && (
#ifdef __APPLE__
				Fl::compose_state || 
#endif
				selstart == selend) &&
	position() >= p-value() && position() <= e-value()) {
      fl_color(cursor_color());
      // cursor position may need to be recomputed (see STR #2486)
      curx = int(expandpos(p, value()+position(), buf, 0)+.5);
      if (readonly()) {
        fl_line((int)(xpos+curx-2.5f), Y+ypos+height-1,
	        (int)(xpos+curx+0.5f), Y+ypos+height-4,
	        (int)(xpos+curx+3.5f), Y+ypos+height-1);
      } else {
        fl_rectf((int)(xpos+curx+0.5), Y+ypos, 2, height);
      }
#ifdef __APPLE__
      Fl::insertion_point_location(xpos+curx, Y+ypos+height, height);
#endif
    }

  CONTINUE:
    ypos += height;
    if (e >= value_+size_) break;
    if (*e == '\n' || *e == ' ') e++;
    p = e;
  }

  // for minimal update, erase all lines below last one if necessary:
  if (input_type()==FL_MULTILINE_INPUT && do_mu && ypos<H
      && (!erase_cursor_only || p <= value()+mu_p)) {
    if (ypos < 0) ypos = 0;
    fl_push_clip(X, Y+ypos, W, H-ypos);
    draw_box(box(), X-Fl::box_dx(box()), Y-Fl::box_dy(box()),
             W+Fl::box_dw(box()), H+Fl::box_dh(box()), color());
    fl_pop_clip();
  }

  fl_pop_clip();
  if (Fl::focus() == this) {
       fl_set_spot(textfont(), textsize(),
               (int)xpos+curx, Y+ypos-fl_descent(), W, H, window());
  }
}